

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe_crypto.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::encryption_handler::switch_recv_crypto
          (encryption_handler *this,shared_ptr<libtorrent::crypto_plugin> *crypto,
          crypto_receive_buffer *recv_buffer)

{
  element_type *peVar1;
  int produce;
  int consume;
  int packet_size;
  vector<libtorrent::span<char>,_std::allocator<libtorrent::span<char>_>_> wr_buf;
  undefined4 local_64;
  undefined4 local_60;
  int local_5c;
  _Vector_base<libtorrent::span<char>,_std::allocator<libtorrent::span<char>_>_> local_58;
  tuple<int,_int,_int> local_34;
  int *local_28;
  undefined4 *local_20;
  undefined4 *local_18;
  
  ::std::__shared_ptr<libtorrent::crypto_plugin,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_dec_handler).
              super___shared_ptr<libtorrent::crypto_plugin,_(__gnu_cxx::_Lock_policy)2>,
             &crypto->super___shared_ptr<libtorrent::crypto_plugin,_(__gnu_cxx::_Lock_policy)2>);
  local_5c = 0;
  peVar1 = (crypto->super___shared_ptr<libtorrent::crypto_plugin,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if (peVar1 != (element_type *)0x0) {
    local_60 = 0;
    local_64 = 0;
    local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (*peVar1->_vptr_crypto_plugin[5])(&local_34,peVar1,0,0);
    local_28 = &local_5c;
    local_20 = &local_64;
    local_18 = &local_60;
    ::std::tuple<int&,int&,int&>::operator=((tuple<int&,int&,int&> *)&local_28,&local_34);
    ::std::_Vector_base<libtorrent::span<char>,_std::allocator<libtorrent::span<char>_>_>::
    ~_Vector_base(&local_58);
  }
  crypto_receive_buffer::crypto_reset(recv_buffer,local_5c);
  return;
}

Assistant:

void encryption_handler::switch_recv_crypto(std::shared_ptr<crypto_plugin> crypto
		, aux::crypto_receive_buffer& recv_buffer)
	{
		m_dec_handler = crypto;
		int packet_size = 0;
		if (crypto)
		{
			int consume = 0;
			int produce = 0;
			std::vector<span<char>> wr_buf;
			std::tie(consume, produce, packet_size) = crypto->decrypt(wr_buf);
			TORRENT_ASSERT(wr_buf.empty());
			TORRENT_ASSERT(consume == 0);
			TORRENT_ASSERT(produce == 0);
		}
		recv_buffer.crypto_reset(packet_size);
	}